

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall testing::Sequence::AddExpectation(Sequence *this,Expectation *expectation)

{
  element_type *peVar1;
  Expectation *__v;
  element_type *peVar2;
  
  __v = (this->last_expectation_).
        super___shared_ptr<testing::Expectation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = (__v->expectation_base_).
           super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  peVar2 = (expectation->expectation_base_).
           super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != peVar2) {
    if (peVar1 != (element_type *)0x0) {
      std::
      _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
      ::_M_insert_unique<testing::Expectation_const&>
                ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                  *)&peVar2->immediate_prerequisites_,__v);
      __v = (this->last_expectation_).
            super___shared_ptr<testing::Expectation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (expectation->expectation_base_).
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    }
    (__v->expectation_base_).
    super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(__v->expectation_base_).
                super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(expectation->expectation_base_).
                super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  return;
}

Assistant:

void Sequence::AddExpectation(const Expectation& expectation) const {
  if (*last_expectation_ != expectation) {
    if (last_expectation_->expectation_base() != nullptr) {
      expectation.expectation_base()->immediate_prerequisites_ +=
          *last_expectation_;
    }
    *last_expectation_ = expectation;
  }
}